

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

bool __thiscall cppjieba::DictTrie::InsertUserWord(DictTrie *this,string *word,string *tag)

{
  bool bVar1;
  long in_RDI;
  DictUnit node_info;
  double in_stack_000000d0;
  string *in_stack_000000d8;
  DictUnit *in_stack_000000e0;
  DictTrie *in_stack_000000e8;
  value_type *in_stack_ffffffffffffff28;
  DictUnit *in_stack_ffffffffffffff30;
  deque<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *this_00;
  deque<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> local_a0;
  DictUnit *in_stack_ffffffffffffffc0;
  Unicode *in_stack_ffffffffffffffc8;
  Trie *in_stack_ffffffffffffffd0;
  
  this_00 = &local_a0;
  DictUnit::DictUnit(in_stack_ffffffffffffff30);
  bVar1 = MakeNodeInfo(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,
                       (string *)this);
  if (bVar1) {
    std::deque<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::push_back
              ((deque<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff30 = *(DictUnit **)(in_RDI + 0x68);
    std::deque<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::back(this_00);
    Trie::InsertNode(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  DictUnit::~DictUnit(in_stack_ffffffffffffff30);
  return bVar1;
}

Assistant:

bool InsertUserWord(const string& word, const string& tag = UNKNOWN_TAG) {
    DictUnit node_info;
    if (!MakeNodeInfo(node_info, word, user_word_default_weight_, tag)) {
      return false;
    }
    active_node_infos_.push_back(node_info);
    trie_->InsertNode(node_info.word, &active_node_infos_.back());
    return true;
  }